

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deh261.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  uint8_t *bytes;
  bitstream *str;
  h261_picparm *picparm;
  h261_gob *gob;
  long lVar3;
  int iVar4;
  bool bVar5;
  uint32_t start_code;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar2 = getchar();
  if (iVar2 == -1) {
    lVar3 = 0;
    bytes = (uint8_t *)0x0;
  }
  else {
    lVar3 = 0;
    bytes = (uint8_t *)0x0;
    iVar4 = 0;
    do {
      if (iVar4 <= lVar3) {
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 * 2;
        if (bVar5) {
          iVar4 = 0x10;
        }
        bytes = (uint8_t *)realloc(bytes,(long)iVar4);
      }
      bytes[lVar3] = (uint8_t)iVar2;
      lVar3 = lVar3 + 1;
      iVar2 = getchar();
    } while (iVar2 != -1);
  }
  str = vs_new_decode(VS_H261,bytes,(int)lVar3);
  picparm = (h261_picparm *)calloc(8,1);
  do {
    while (iVar2 = vs_start(str,(uint32_t *)((long)&uStack_38 + 4)), iVar2 != 0) {
LAB_0010157b:
      iVar2 = vs_search_start(str);
      if (iVar2 == 0) {
        return 0;
      }
      if (iVar2 == -1) {
        return 1;
      }
      putchar(10);
    }
    printf("Start code: %02x\n",uStack_38 >> 0x20);
    uVar1 = uStack_38._4_4_;
    if (uStack_38._4_4_ != 0) {
      if (uStack_38._4_4_ < 0xd) {
        gob = (h261_gob *)calloc(0xc89c,1);
        gob->gn = uVar1;
        iVar2 = h261_gob(str,gob);
        h261_print_gob(gob);
        h261_del_gob(gob);
        if (iVar2 == 0) goto LAB_0010160d;
      }
      else {
        fprintf(_stderr,"Invalid start code %d\n",(ulong)uStack_38._4_4_);
      }
      goto LAB_0010157b;
    }
    iVar2 = h261_picparm(str,picparm);
    if (iVar2 != 0) goto LAB_0010157b;
    h261_print_picparm(picparm);
LAB_0010160d:
    puts("NAL decoded successfully\n");
  } while( true );
}

Assistant:

int main() {
	uint8_t *bytes = 0;
	int bytesnum = 0;
	int bytesmax = 0;
	int c;
	int res;
	while ((c = getchar()) != EOF) {
		ADDARRAY(bytes, c);
	}
	struct bitstream *str = vs_new_decode(VS_H261, bytes, bytesnum);
	struct h261_picparm *picparm = calloc(sizeof *picparm, 1);
	while (1) {
		uint32_t start_code;
		if (vs_start(str, &start_code)) goto err;
		printf("Start code: %02x\n", start_code);
		if (start_code == 0) {
			if (h261_picparm(str, picparm)) goto err;
			h261_print_picparm(picparm);
		} else if (start_code <= 12) {
			struct h261_gob *gob = calloc (sizeof *gob, 1);
			gob->gn = start_code;
			if (h261_gob(str, gob)) {
				h261_print_gob(gob);
				h261_del_gob(gob);
				goto err;
			}
			h261_print_gob(gob);
			h261_del_gob(gob);
		} else {
			fprintf(stderr, "Invalid start code %d\n", start_code);
			goto err;
		}
		printf("NAL decoded successfully\n\n");
		continue;
err:
		res = vs_search_start(str);
		if (res == -1)
			return 1;
		if (!res)
			break;
		printf("\n");
	}
	return 0;
}